

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

void __thiscall
JsonParser_serialize_array_Test::JsonParser_serialize_array_Test
          (JsonParser_serialize_array_Test *this)

{
  JsonParser_serialize_array_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__JsonParser_serialize_array_Test_00811c38;
  return;
}

Assistant:

TEST(JsonParser, serialize_array) {
	json_parser parser;
	std::vector<object> array {
		true,
		1234,
		u8"text",
		object{}
	};

	EXPECT_EQ(parser.serialize<char8_t>(array),
		u8R"json([true,1234,"text",null])json");
}